

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall MinVR::VRDatumIntArray::VRDatumIntArray(VRDatumIntArray *this,VRIntArray *inVal)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>
  *in_stack_ffffffffffffffe0;
  
  std::vector<int,_std::allocator<int>_>::vector(in_stack_00000010,in_stack_00000008);
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>::
  VRDatumSpecialized(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__VRDatumIntArray_00179a88;
  return;
}

Assistant:

VRIntArray getValueIntArray() const { return value.front(); }